

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int __thiscall ON_MappingChannel::Compare(ON_MappingChannel *this,ON_MappingChannel *other)

{
  int iVar1;
  
  iVar1 = this->m_mapping_channel_id - other->m_mapping_channel_id;
  if (iVar1 == 0) {
    iVar1 = ON_UuidCompare(&this->m_mapping_id,&other->m_mapping_id);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ON_Xform::Compare(&this->m_object_xform,&other->m_object_xform);
  return iVar1;
}

Assistant:

int ON_MappingChannel::Compare( const ON_MappingChannel& other ) const
{
  int rc = m_mapping_channel_id - other.m_mapping_channel_id;
  if (!rc)
    rc = ON_UuidCompare(m_mapping_id,other.m_mapping_id);
  if (!rc)
    rc = m_object_xform.Compare(other.m_object_xform);
  return rc;
}